

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kd_tree.hpp
# Opt level: O0

void __thiscall
pico_tree::
kd_tree<std::vector<pico_tree::point<float,2ul>,std::allocator<pico_tree::point<float,2ul>>>,pico_tree::metric_l2_squared,int>
::
search_nearest<pico_tree::internal::point_wrapper<pico_tree::point<float,2ul>>,search_nn_counter<pico_tree::neighbor<int,float>>>
          (void *param_1,undefined8 param_2,undefined8 param_3)

{
  node_type *in_stack_ffffffffffffff88;
  space_wrapper<std::vector<pico_tree::point<float,_2UL>,_std::allocator<pico_tree::point<float,_2UL>_>_>_>
  local_58;
  search_nearest_euclidean<pico_tree::internal::space_wrapper<std::vector<pico_tree::point<float,_2UL>,_std::allocator<pico_tree::point<float,_2UL>_>_>_>,_pico_tree::metric_l2_squared,_pico_tree::internal::point_wrapper<pico_tree::point<float,_2UL>_>,_search_nn_counter<pico_tree::neighbor<int,_float>_>,_int>
  local_50;
  undefined8 local_20;
  void *local_18;
  undefined8 local_8;
  
  local_20 = param_3;
  local_18 = param_1;
  local_8 = param_2;
  internal::
  space_wrapper<std::vector<pico_tree::point<float,_2UL>,_std::allocator<pico_tree::point<float,_2UL>_>_>_>
  ::space_wrapper(&local_58,(space_type *)param_1);
  internal::
  search_nearest_euclidean<pico_tree::internal::space_wrapper<std::vector<pico_tree::point<float,_2UL>,_std::allocator<pico_tree::point<float,_2UL>_>_>_>,_pico_tree::metric_l2_squared,_pico_tree::internal::point_wrapper<pico_tree::point<float,_2UL>_>,_search_nn_counter<pico_tree::neighbor<int,_float>_>,_int>
  ::search_nearest_euclidean
            (&local_50,local_58.space_,
             &((search_nearest_euclidean<pico_tree::internal::space_wrapper<std::vector<pico_tree::point<float,_2UL>,_std::allocator<pico_tree::point<float,_2UL>_>_>_>,_pico_tree::metric_l2_squared,_pico_tree::internal::point_wrapper<pico_tree::point<float,_2UL>_>,_search_nn_counter<pico_tree::neighbor<int,_float>_>,_int>
                *)param_1)->node_box_offset_,local_8,local_20);
  internal::
  search_nearest_euclidean<pico_tree::internal::space_wrapper<std::vector<pico_tree::point<float,_2UL>,_std::allocator<pico_tree::point<float,_2UL>_>_>_>,_pico_tree::metric_l2_squared,_pico_tree::internal::point_wrapper<pico_tree::point<float,_2UL>_>,_search_nn_counter<pico_tree::neighbor<int,_float>_>,_int>
  ::operator()((search_nearest_euclidean<pico_tree::internal::space_wrapper<std::vector<pico_tree::point<float,_2UL>,_std::allocator<pico_tree::point<float,_2UL>_>_>_>,_pico_tree::metric_l2_squared,_pico_tree::internal::point_wrapper<pico_tree::point<float,_2UL>_>,_search_nn_counter<pico_tree::neighbor<int,_float>_>,_int>
                *)param_1,in_stack_ffffffffffffff88);
  return;
}

Assistant:

inline void search_nearest(
      PointWrapper_ point, Visitor_& visitor, euclidean_space_tag) const {
    internal::search_nearest_euclidean<
        space_wrapper_type,
        Metric_,
        PointWrapper_,
        Visitor_,
        index_type>(
        space_wrapper_type(space_), metric_, data_.indices, point, visitor)(
        data_.root_node);
  }